

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalPrint<phmap::priv::(anonymous_namespace)::StringTable>
               (StringTable *value,ostream *os)

{
  ostream *os_local;
  StringTable *value_local;
  
  UniversalPrinter<phmap::priv::(anonymous_namespace)::StringTable>::Print(value,os);
  return;
}

Assistant:

void UniversalPrint(const T& value, ::std::ostream* os) {
  // A workarond for the bug in VC++ 7.1 that prevents us from instantiating
  // UniversalPrinter with T directly.
  typedef T T1;
  UniversalPrinter<T1>::Print(value, os);
}